

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::on_string
          (tag_scalar_t<int,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  exception_t<cfgfile::string_trait_t> *this_00;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  int value;
  string *in_stack_fffffffffffff838;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff840;
  string_t *in_stack_fffffffffffff848;
  allocator *paVar5;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffff850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  allocator local_731;
  string local_730 [103];
  allocator local_6c9;
  string local_6c8 [71];
  allocator local_681;
  string local_680 [71];
  allocator local_639;
  string local_638 [262];
  undefined1 local_532;
  allocator local_531;
  string local_530 [103];
  allocator local_4c9;
  string local_4c8 [71];
  allocator local_481;
  string local_480 [71];
  allocator local_439;
  string local_438 [71];
  allocator local_3f1;
  string local_3f0 [168];
  string_t *in_stack_fffffffffffffcb8;
  parser_info_t<cfgfile::string_trait_t> *in_stack_fffffffffffffcc0;
  int local_2b0;
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [103];
  allocator local_241;
  string local_240 [71];
  allocator local_1f9;
  string local_1f8 [71];
  allocator local_1b1;
  string local_1b0 [87];
  allocator local_159;
  string local_158 [328];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined_member_value(in_RDI);
  if (bVar1) {
    this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_638,"Value for the tag \"",&local_639);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    paVar5 = &local_681;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_680,"\" already defined. In file \"",paVar5);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   in_stack_fffffffffffff840);
    paVar4 = &local_6c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6c8,"\" on line ",paVar4);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    paVar4 = &local_731;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,".",paVar4);
    string_trait_t::from_ascii((string *)paVar4);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,(string_t *)paVar5);
    __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_any_child_defined(in_stack_fffffffffffff850);
  if (bVar1) {
    local_2aa = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"Value \"",&local_159);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"\" for tag \"",&local_1b1);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1f8,"\" must be defined before any child tag. In file \"",&local_1f9);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"\" on line ",&local_241);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8,".",&local_2a9);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    exception_t<cfgfile::string_trait_t>::exception_t
              ((exception_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_2aa = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  local_2b0 = format_t<int,_cfgfile::string_trait_t>::from_string
                        (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  if ((*(long *)&in_RDI[1].m_name != 0) &&
     (uVar2 = (**(code **)(**(long **)&in_RDI[1].m_name + 0x10))
                        (*(long **)&in_RDI[1].m_name,&local_2b0), (uVar2 & 1) == 0)) {
    local_532 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,"Invalid value: \"",&local_3f1);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    paVar5 = &local_439;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_438,"\". Value must match to the constraint in tag \"",paVar5);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   in_stack_fffffffffffff870);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    paVar4 = &local_481;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"\". In file \"",paVar4);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"\" on line ",&local_4c9);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff838);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,".",&local_531);
    string_trait_t::from_ascii(in_stack_fffffffffffff838);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4);
    exception_t<cfgfile::string_trait_t>::exception_t
              ((exception_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_532 = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  *(int *)&in_RDI[1]._vptr_tag_t = local_2b0;
  tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
  return;
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( !this->is_defined_member_value() )
		{
			if( this->is_any_child_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Value \"" ) + str +
					Trait::from_ascii( "\" for tag \"" ) + this->name() +
					Trait::from_ascii( "\" must be defined before any "
						"child tag. In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );

			T value = format_t< T, Trait >::from_string( info, str );

			if( m_constraint )
			{
				if( !m_constraint->check( value ) )
					throw exception_t< Trait >(
						Trait::from_ascii( "Invalid value: \"" ) +
						str +
						Trait::from_ascii( "\". Value must match to the "
							"constraint in tag \"" ) +
						this->name() + Trait::from_ascii( "\". In file \"" ) +
						info.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( info.line_number() ) +
						Trait::from_ascii( "." ) );
			}

			m_value = value;

			this->set_defined();
		}
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Value for the tag \"" ) +
				this->name() +
				Trait::from_ascii( "\" already defined. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}